

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

Array<kj::_::HashBucket> * __thiscall
kj::_::rehash(Array<kj::_::HashBucket> *__return_storage_ptr__,_ *this,
             ArrayPtr<const_kj::_::HashBucket> oldBuckets,size_t targetSize)

{
  int iVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  HashBucket *__s;
  HashBucket *pHVar4;
  ulong uVar5;
  uint uVar6;
  HashBucket *elementCount;
  uint uVar7;
  HashBucket *__begin2;
  uint collisionCount;
  uint entryCount;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  size_t targetSize_local;
  
  targetSize_local = oldBuckets.size_;
  pHVar4 = oldBuckets.ptr;
  _kjCondition.left = &targetSize_local;
  _kjCondition.right = 0x40000000;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = targetSize_local < 0x40000000;
  if (!_kjCondition.result) {
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[36]>
              ((Fault *)&entryCount,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
               ,0x47,FAILED,"targetSize < (1 << 30)",
               "_kjCondition,\"hash table has reached maximum size\"",&_kjCondition,
               (char (*) [36])"hash table has reached maximum size");
    Debug::Fault::fatal((Fault *)&entryCount);
  }
  iVar1 = 0x1f;
  if ((uint)oldBuckets.size_ != 0) {
    for (; (uint)oldBuckets.size_ >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  elementCount = (HashBucket *)(long)(2 << ((byte)iVar1 & 0x1f));
  if (targetSize_local == 0) {
    elementCount = (HashBucket *)0x0;
  }
  if (elementCount <= pHVar4) {
    elementCount = pHVar4;
  }
  uVar7 = 0;
  __s = (HashBucket *)
        HeapArrayDisposer::allocateImpl
                  (8,(size_t)elementCount,(size_t)elementCount,(_func_void_void_ptr *)0x0,
                   (_func_void_void_ptr *)0x0);
  __return_storage_ptr__->ptr = __s;
  __return_storage_ptr__->size_ = (size_t)elementCount;
  __return_storage_ptr__->disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  memset(__s,0,(long)elementCount << 3);
  entryCount = 0;
  collisionCount = 0;
  if (pHVar4 != (HashBucket *)0x0) {
    pHVar4 = (HashBucket *)(this + (long)pHVar4 * 8);
    uVar6 = 0;
    do {
      if (1 < ((HashBucket *)this)->value) {
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)((HashBucket *)this)->hash % __return_storage_ptr__->size_;
        while( true ) {
          uVar5 = uVar5 & 0xffffffff;
          if (__return_storage_ptr__->ptr[uVar5].value == 0) break;
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 + 1;
          collisionCount = uVar6;
          if (uVar5 == __return_storage_ptr__->size_) {
            uVar5 = 0;
          }
        }
        __return_storage_ptr__->ptr[uVar5] = *(HashBucket *)this;
        entryCount = uVar7;
      }
      this = (_ *)((long)this + 8);
    } while ((HashBucket *)this != pHVar4);
  }
  if ((entryCount * 4 + 0x10 < collisionCount) &&
     (rehash(kj::ArrayPtr<kj::_::HashBucket_const>,unsigned_long)::warned == '\0')) {
    if (Debug::minSeverity < 2) {
      getStackTrace();
      Debug::log<char_const(&)[71],unsigned_int&,unsigned_int&,kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                 ,0x67,WARNING,
                 "\"detected excessive collisions in hash table; is your hash function OK?\", entryCount, collisionCount, kj::getStackTrace()"
                 ,(char (*) [71])
                  "detected excessive collisions in hash table; is your hash function OK?",
                 &entryCount,&collisionCount,(String *)&_kjCondition);
      uVar3 = _kjCondition._8_8_;
      puVar2 = _kjCondition.left;
      if (_kjCondition.left != (unsigned_long *)0x0) {
        _kjCondition.left = (unsigned_long *)0x0;
        _kjCondition.right = 0;
        _kjCondition._12_4_ = 0;
        (*(code *)**(undefined8 **)_kjCondition.op.content.ptr)
                  (_kjCondition.op.content.ptr,puVar2,1,uVar3,uVar3,0);
      }
    }
    rehash(kj::ArrayPtr<kj::_::HashBucket_const>,unsigned_long)::warned = '\x01';
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Array<HashBucket> rehash(kj::ArrayPtr<const HashBucket> oldBuckets, size_t targetSize) {
  // Rehash the whole table.

  KJ_REQUIRE(targetSize < (1 << 30), "hash table has reached maximum size");

  size_t size = chooseHashTableSize(targetSize);

  if (size < oldBuckets.size()) {
    size = oldBuckets.size();
  }

  auto newBuckets = kj::heapArray<HashBucket>(size);
  memset(newBuckets.begin(), 0, sizeof(HashBucket) * size);

  uint entryCount = 0;
  uint collisionCount = 0;

  for (auto& oldBucket: oldBuckets) {
    if (oldBucket.isOccupied()) {
      ++entryCount;
      for (uint i = oldBucket.hash % newBuckets.size();; i = probeHash(newBuckets, i)) {
        auto& newBucket = newBuckets[i];
        if (newBucket.isEmpty()) {
          newBucket = oldBucket;
          break;
        }
        ++collisionCount;
      }
    }
  }

  if (collisionCount > 16 + entryCount * 4) {
    static bool warned = false;
    if (!warned) {
      KJ_LOG(WARNING, "detected excessive collisions in hash table; is your hash function OK?",
          entryCount, collisionCount, kj::getStackTrace());
      warned = true;
    }
  }

  return newBuckets;
}